

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netmessagemaker.h
# Opt level: O0

CSerializedNetMsg *
NetMsg::
Make<int_const&,unsigned_long_const&,long_const&,unsigned_long_const&,ParamsWrapper<CAddress::SerParams,CService_const>>
          (string *msg_type,int *args,unsigned_long *args_1,long *args_2,unsigned_long *args_3,
          ParamsWrapper<CAddress::SerParams,_const_CService> *args_4)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  CSerializedNetMsg *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  ParamsWrapper<CAddress::SerParams,_const_CService> *in_R9;
  long in_FS_OFFSET;
  long *in_stack_00000008;
  CSerializedNetMsg *msg;
  CSerializedNetMsg *in_stack_ffffffffffffff68;
  unsigned_long *in_stack_ffffffffffffff78;
  int *in_stack_ffffffffffffff80;
  CSerializedNetMsg *this;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  this = in_RDI;
  CSerializedNetMsg::CSerializedNetMsg(in_stack_ffffffffffffff68);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_RCX,in_R8);
  VectorWriter::
  VectorWriter<int_const&,unsigned_long_const&,long_const&,unsigned_long_const&,ParamsWrapper<CAddress::SerParams,CService_const>>
            ((VectorWriter *)this,in_RSI,(size_t)in_RDI,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff78,in_stack_00000008,
             (unsigned_long *)CONCAT17(uVar2,in_stack_ffffffffffffffb0),in_R9);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CSerializedNetMsg Make(std::string msg_type, Args&&... args)
    {
        CSerializedNetMsg msg;
        msg.m_type = std::move(msg_type);
        VectorWriter{msg.data, 0, std::forward<Args>(args)...};
        return msg;
    }